

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

Vec_Ptr_t * Prs_ManReadVerilog(char *pFileName)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Prs_Man_t *p;
  FILE *__stream;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  undefined4 extraout_var;
  Abc_Nam_t *pAVar10;
  Hash_IntMan_t *pHVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  Vec_Ptr_t *pVVar14;
  void **ppvVar15;
  byte *pbVar16;
  ulong uVar17;
  int iVar18;
  uint extraout_EDX;
  int fSlices;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  undefined8 extraout_RDX;
  undefined8 uVar19;
  undefined8 extraout_RDX_00;
  uint uVar20;
  long lVar21;
  byte *pbVar22;
  int local_44;
  
  p = (Prs_Man_t *)calloc(1,0x4c0);
  if (pFileName == (char *)0x0) {
LAB_003b70b2:
    pAVar10 = Abc_NamStart(1000,0x18);
    p->pStrs = pAVar10;
    pAVar10 = Abc_NamStart(100,0x18);
    p->pFuns = pAVar10;
    pHVar11 = (Hash_IntMan_t *)calloc(1,0x18);
    uVar20 = 1099;
    while( true ) {
      do {
        uVar5 = uVar20;
        uVar20 = uVar5 + 1;
      } while ((uVar5 & 1) != 0);
      if (uVar20 < 9) break;
      iVar18 = 5;
      while (uVar20 % (iVar18 - 2U) != 0) {
        uVar4 = iVar18 * iVar18;
        iVar18 = iVar18 + 2;
        if (uVar20 < uVar4) goto LAB_003b7120;
      }
    }
LAB_003b7120:
    pVVar12 = (Vec_Int_t *)malloc(0x10);
    uVar4 = 0x10;
    if (0xe < uVar5) {
      uVar4 = uVar20;
    }
    pVVar12->nSize = 0;
    pVVar12->nCap = uVar4;
    piVar13 = (int *)malloc((long)(int)uVar4 << 2);
    pVVar12->pArray = piVar13;
    pVVar12->nSize = uVar20;
    if (piVar13 != (int *)0x0) {
      memset(piVar13,0,(long)(int)uVar20 << 2);
    }
    pHVar11->vTable = pVVar12;
    pVVar12 = (Vec_Int_t *)malloc(0x10);
    pVVar12->nCap = 0x1130;
    pVVar12->nSize = 0;
    piVar13 = (int *)malloc(0x44c0);
    pVVar12->pArray = piVar13;
    pHVar11->vObjs = pVVar12;
    piVar13[0] = 0;
    piVar13[1] = 0;
    piVar13[2] = 0;
    piVar13[3] = 0;
    pVVar12->nSize = 4;
    pHVar11->nRefs = 1;
    p->vHash = pHVar11;
    pVVar14 = (Vec_Ptr_t *)malloc(0x10);
    pVVar14->nCap = 100;
    pVVar14->nSize = 0;
    ppvVar15 = (void **)malloc(800);
    pVVar14->pArray = ppvVar15;
    p->vNtks = pVVar14;
  }
  else {
    __stream = fopen(pFileName,"rb");
    if (__stream == (FILE *)0x0) {
      iVar18 = puts("Cannot open input file.");
      pcVar9 = (char *)CONCAT44(extraout_var,iVar18);
      pcVar8 = (char *)0x0;
    }
    else {
      fseek(__stream,0,2);
      lVar7 = ftell(__stream);
      rewind(__stream);
      lVar21 = lVar7 << 0x20;
      pcVar8 = (char *)malloc(lVar21 + 0x1000000000 >> 0x20);
      *pcVar8 = '\n';
      fread(pcVar8 + 1,(long)(int)lVar7,1,__stream);
      fclose(__stream);
      pcVar8[lVar21 + 0x100000000 >> 0x20] = '\n';
      pcVar8[lVar21 + 0x200000000 >> 0x20] = '\0';
      pcVar9 = pcVar8 + (long)(int)lVar7 + 3;
    }
    if (pcVar8 != (char *)0x0) {
      p->pName = pFileName;
      p->pBuffer = pcVar8;
      p->pLimit = pcVar9;
      p->pCur = pcVar8;
      goto LAB_003b70b2;
    }
    p = (Prs_Man_t *)0x0;
  }
  if (p == (Prs_Man_t *)0x0) {
    return (Vec_Ptr_t *)0x0;
  }
  Abc_NamStrFindOrAdd(p->pFuns,"1\'b0",(int *)0x0);
  Abc_NamStrFindOrAdd(p->pFuns,"1\'b1",(int *)0x0);
  Abc_NamStrFindOrAdd(p->pFuns,"1\'bx",(int *)0x0);
  Abc_NamStrFindOrAdd(p->pFuns,"1\'bz",(int *)0x0);
  Prs_NtkAddVerilogDirectives(p);
  pcVar8 = p->ErrorStr;
  do {
    if (p->pNtk == (Prs_Ntk_t *)0x0) {
      pbVar22 = (byte *)p->pLimit;
      pbVar16 = (byte *)p->pCur;
      while (pbVar16 < pbVar22) {
        while( true ) {
          uVar17 = (ulong)*pbVar16;
          if (0x2f < uVar17) goto LAB_003b7340;
          if ((0x100002600U >> (uVar17 & 0x3f) & 1) == 0) break;
          pbVar16 = pbVar16 + 1;
          p->pCur = (char *)pbVar16;
        }
        if (uVar17 != 0x2f) {
          if (uVar17 != 0) {
LAB_003b7340:
            pbVar16 = (byte *)p->pCur;
            goto LAB_003b7344;
          }
          break;
        }
        if (pbVar16[1] != 0x2a) {
          if (pbVar16[1] == 0x2f) {
            pbVar16 = pbVar16 + 2;
            p->pCur = (char *)pbVar16;
            if (pbVar16 < pbVar22) {
              while (*pbVar16 != 10) {
                pbVar16 = pbVar16 + 1;
                p->pCur = (char *)pbVar16;
                if (pbVar16 == pbVar22) goto LAB_003b7340;
              }
              pbVar16 = pbVar16 + 1;
              goto LAB_003b732e;
            }
          }
          goto LAB_003b7340;
        }
        pbVar16 = pbVar16 + 2;
        p->pCur = (char *)pbVar16;
        if (pbVar22 <= pbVar16) goto LAB_003b7340;
        while ((*pbVar16 != 0x2a || (pbVar16[1] != 0x2f))) {
          pbVar16 = pbVar16 + 1;
          p->pCur = (char *)pbVar16;
          if (pbVar16 == pbVar22) goto LAB_003b7340;
        }
        pbVar16 = pbVar16 + 2;
LAB_003b732e:
        p->pCur = (char *)pbVar16;
      }
LAB_003b7412:
      if (*pcVar8 != '\0') goto LAB_003b7b22;
      pcVar8[0] = 'U';
      pcVar8[1] = 'n';
      pcVar8[2] = 'e';
      pcVar8[3] = 'x';
      pcVar8[4] = 'p';
      pcVar8[5] = 'e';
      pcVar8[6] = 'c';
      pcVar8[7] = 't';
      p->ErrorStr[8] = 'e';
      p->ErrorStr[9] = 'd';
      p->ErrorStr[10] = 'l';
      p->ErrorStr[0xb] = 'y';
      p->ErrorStr[0xc] = ' ';
      p->ErrorStr[0xd] = 'r';
      p->ErrorStr[0xe] = 'e';
      p->ErrorStr[0xf] = 'a';
      p->ErrorStr[0x10] = 'c';
      p->ErrorStr[0x11] = 'h';
      p->ErrorStr[0x12] = 'e';
      p->ErrorStr[0x13] = 'd';
      p->ErrorStr[0x14] = ' ';
      p->ErrorStr[0x15] = 'e';
      p->ErrorStr[0x16] = 'n';
      p->ErrorStr[0x17] = 'd';
      p->ErrorStr[0x18] = '-';
      p->ErrorStr[0x19] = 'o';
      p->ErrorStr[0x1a] = 'f';
      p->ErrorStr[0x1b] = '-';
      p->ErrorStr[0x1c] = 'f';
      p->ErrorStr[0x1d] = 'i';
      p->ErrorStr[0x1e] = 'l';
      p->ErrorStr[0x1f] = 'e';
      p->ErrorStr[0x20] = '.';
      p->ErrorStr[0x21] = '\0';
      *pcVar8 = '\0';
LAB_003b743e:
      iVar18 = 0;
    }
    else {
      if (*pcVar8 != '\0') {
LAB_003b7b22:
        __assert_fail("!p->ErrorStr[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaPrs.h"
                      ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
      }
      builtin_strncpy(pcVar8,"Parsing previous module is unfinished.",0x27);
LAB_003b7293:
      iVar18 = 4;
    }
LAB_003b7441:
  } while (iVar18 - 1U < 3);
  Prs_ManPrintModules(p);
  cVar2 = p->ErrorStr[0];
  if (cVar2 != '\0') {
    pcVar9 = p->pBuffer;
    uVar17 = 0;
    if (pcVar9 < p->pCur) {
      uVar17 = 0;
      do {
        uVar17 = (ulong)((int)uVar17 + (uint)(*pcVar9 == '\n'));
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != p->pCur);
    }
    pVVar14 = (Vec_Ptr_t *)0x0;
    printf("Line %d: %s\n",uVar17,pcVar8);
    if (cVar2 != '\0') goto LAB_003b7941;
  }
  pVVar14 = p->vNtks;
  p->vNtks = (Vec_Ptr_t *)0x0;
LAB_003b7941:
  if (p->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pStrs);
  }
  if (p->pFuns != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pFuns);
  }
  pHVar11 = p->vHash;
  if (pHVar11 != (Hash_IntMan_t *)0x0) {
    piVar13 = &pHVar11->nRefs;
    *piVar13 = *piVar13 + -1;
    if (*piVar13 == 0) {
      pVVar12 = pHVar11->vObjs;
      if (pVVar12->pArray != (int *)0x0) {
        free(pVVar12->pArray);
        pVVar12->pArray = (int *)0x0;
      }
      if (pVVar12 != (Vec_Int_t *)0x0) {
        free(pVVar12);
      }
      pVVar12 = pHVar11->vTable;
      if (pVVar12->pArray != (int *)0x0) {
        free(pVVar12->pArray);
        pVVar12->pArray = (int *)0x0;
      }
      if (pVVar12 != (Vec_Int_t *)0x0) {
        free(pVVar12);
      }
      free(pHVar11);
    }
  }
  if (p->vNtks != (Vec_Ptr_t *)0x0) {
    Prs_ManVecFree(p->vNtks);
  }
  pcVar8 = (p->vCover).pArray;
  if (pcVar8 != (char *)0x0) {
    free(pcVar8);
    (p->vCover).pArray = (char *)0x0;
  }
  (p->vCover).nCap = 0;
  (p->vCover).nSize = 0;
  piVar13 = (p->vTemp).pArray;
  if (piVar13 != (int *)0x0) {
    free(piVar13);
    (p->vTemp).pArray = (int *)0x0;
  }
  (p->vTemp).nCap = 0;
  (p->vTemp).nSize = 0;
  piVar13 = (p->vTemp2).pArray;
  if (piVar13 != (int *)0x0) {
    free(piVar13);
    (p->vTemp2).pArray = (int *)0x0;
  }
  (p->vTemp2).nCap = 0;
  (p->vTemp2).nSize = 0;
  piVar13 = (p->vTemp3).pArray;
  if (piVar13 != (int *)0x0) {
    free(piVar13);
    (p->vTemp3).pArray = (int *)0x0;
  }
  (p->vTemp3).nCap = 0;
  (p->vTemp3).nSize = 0;
  piVar13 = (p->vTemp4).pArray;
  if (piVar13 != (int *)0x0) {
    free(piVar13);
    (p->vTemp4).pArray = (int *)0x0;
  }
  (p->vTemp4).nCap = 0;
  (p->vTemp4).nSize = 0;
  piVar13 = (p->vKnown).pArray;
  if (piVar13 != (int *)0x0) {
    free(piVar13);
    (p->vKnown).pArray = (int *)0x0;
  }
  (p->vKnown).nCap = 0;
  (p->vKnown).nSize = 0;
  piVar13 = (p->vFailed).pArray;
  if (piVar13 != (int *)0x0) {
    free(piVar13);
    (p->vFailed).pArray = (int *)0x0;
  }
  (p->vFailed).nCap = 0;
  (p->vFailed).nSize = 0;
  piVar13 = (p->vSucceeded).pArray;
  if (piVar13 != (int *)0x0) {
    free(piVar13);
    (p->vSucceeded).pArray = (int *)0x0;
  }
  (p->vSucceeded).nCap = 0;
  (p->vSucceeded).nSize = 0;
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  free(p);
  return pVVar14;
LAB_003b7344:
  bVar1 = *pbVar16;
  if (bVar1 == 0x60) goto code_r0x003b7352;
  if (bVar1 == 0x5c) {
    pbVar16 = pbVar16 + 1;
    pbVar22 = pbVar16;
    do {
      p->pCur = (char *)pbVar22;
      bVar1 = *pbVar22;
      pbVar22 = pbVar22 + 1;
    } while (bVar1 != 0x20);
  }
  else {
    if ((bVar1 != 0x5f) && ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) goto LAB_003b756e;
    pbVar22 = pbVar16 + 1;
    do {
      do {
        p->pCur = (char *)pbVar22;
        bVar1 = *pbVar22;
        pbVar22 = pbVar22 + 1;
      } while (0xf5 < (byte)(bVar1 - 0x3a));
    } while (((bVar1 == 0x24) || (bVar1 == 0x5f)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
  }
  iVar18 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar16,p->pCur,(int *)0x0);
  if (iVar18 != 6) {
LAB_003b756e:
    if (*pcVar8 != '\0') goto LAB_003b7b22;
    builtin_strncpy(pcVar8,"Cannot read \"module\" keyword.",0x1e);
    goto LAB_003b7293;
  }
  pbVar22 = (byte *)p->pLimit;
  pbVar16 = (byte *)p->pCur;
  do {
    if (pbVar22 <= pbVar16) {
LAB_003b7599:
      if (*pcVar8 != '\0') goto LAB_003b7b22;
      builtin_strncpy(pcVar8,"Unexpectedly reached end-of-file.",0x22);
      goto LAB_003b7293;
    }
    while( true ) {
      uVar17 = (ulong)*pbVar16;
      uVar20 = (uint)*pbVar16;
      if (0x2f < uVar17) goto LAB_003b75c6;
      if ((0x100002600U >> (uVar17 & 0x3f) & 1) == 0) break;
      pbVar16 = pbVar16 + 1;
      p->pCur = (char *)pbVar16;
    }
    if (uVar17 != 0x2f) {
      if (uVar17 == 0) goto LAB_003b7599;
LAB_003b75c6:
      pbVar22 = (byte *)p->pCur;
      bVar1 = *pbVar22;
      if (bVar1 == 0x5c) {
        pbVar22 = pbVar22 + 1;
        pbVar16 = pbVar22;
        do {
          p->pCur = (char *)pbVar16;
          bVar1 = *pbVar16;
          pbVar16 = pbVar16 + 1;
        } while (bVar1 != 0x20);
LAB_003b761e:
        uVar5 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar22,p->pCur,(int *)0x0);
        uVar20 = extraout_EDX;
      }
      else if ((bVar1 == 0x5f) || (uVar5 = 0, 0xe5 < (byte)((bVar1 & 0xdf) + 0xa5))) {
        pbVar16 = pbVar22 + 1;
        do {
          do {
            p->pCur = (char *)pbVar16;
            bVar1 = *pbVar16;
            pbVar16 = pbVar16 + 1;
          } while (0xf5 < (byte)(bVar1 - 0x3a));
        } while (((bVar1 == 0x24) || (bVar1 == 0x5f)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
        goto LAB_003b761e;
      }
      if (uVar5 == 0) {
        pcVar9 = "Cannot read module name.";
LAB_003b767a:
        Prs_ManErrorSet(p,pcVar9,uVar20);
        goto LAB_003b7293;
      }
      pcVar9 = Abc_NamStr(p->pStrs,uVar5);
      iVar18 = Prs_ManIsKnownModule(pcVar9);
      if (iVar18 != 0) {
        iVar18 = Prs_ManUtilSkipUntilWord(p,"endmodule");
        if (iVar18 != 0) {
          pcVar9 = "Cannot find \"endmodule\" keyword.";
          uVar20 = extraout_EDX_00;
          goto LAB_003b767a;
        }
        Vec_IntPush(&p->vKnown,uVar5);
        iVar18 = 2;
        goto LAB_003b7441;
      }
      uVar17 = (ulong)uVar5;
      Prs_ManInitializeNtk(p,uVar5,fSlices);
      iVar6 = Prs_ManUtilSkipSpaces(p);
      iVar18 = 4;
      if (iVar6 != 0) goto LAB_003b7441;
      if (*p->pCur != '(') {
        pcVar9 = "Cannot find \"(\" in the argument declaration.";
        iVar6 = extraout_EDX_01;
LAB_003b786f:
        Prs_ManErrorSet(p,pcVar9,iVar6);
        goto LAB_003b7441;
      }
      iVar6 = Prs_ManReadArguments(p);
      if (iVar6 == 0) goto LAB_003b7441;
      if (*p->pCur != ')') {
        __assert_fail("*p->pCur == \')\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x4d4,"int Prs_ManReadModule(Prs_Man_t *)");
      }
      p->pCur = p->pCur + 1;
      iVar6 = Prs_ManUtilSkipSpaces(p);
      if (iVar6 != 0) goto LAB_003b7441;
      bVar3 = false;
      local_44 = -1;
      uVar19 = extraout_RDX;
      do {
        iVar6 = (int)uVar19;
        if (*p->pCur != ';' && !bVar3) {
          pcVar9 = "Cannot find \";\" in the module definition.";
          goto LAB_003b786f;
        }
        if (!bVar3) {
          p->pCur = p->pCur + 1;
        }
        iVar6 = Prs_ManUtilSkipSpaces(p);
        if (iVar6 != 0) goto LAB_003b7441;
        uVar20 = Prs_ManReadName(p);
        if (uVar20 == 0x10) {
          Vec_IntPush(&p->vSucceeded,p->pNtk->iModuleName);
          if (p->pNtk == (Prs_Ntk_t *)0x0) {
            __assert_fail("p->pNtk != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaPrs.h"
                          ,0xe2,"void Prs_ManFinalizeNtk(Prs_Man_t *)");
          }
          p->pNtk = (Prs_Ntk_t *)0x0;
          iVar18 = 1;
          goto LAB_003b7441;
        }
        if (uVar20 - 1 < 5) {
          if (uVar20 == 5) {
            uVar20 = 4;
          }
          uVar17 = (ulong)uVar20;
          local_44 = Prs_ManReadDeclaration(p,uVar20);
LAB_003b776f:
          bVar3 = false;
          goto LAB_003b781a;
        }
        switch(uVar20) {
        default:
          uVar17 = (ulong)uVar20;
          local_44 = Prs_ManReadInstance(p,uVar20);
          bVar3 = false;
          break;
        case 7:
LAB_003b778c:
          uVar20 = Prs_ManReadSignal(p);
          iVar6 = extraout_EDX_02;
          if (uVar20 == 0) {
            pcVar9 = "Cannot read output in assign-statement.";
            goto LAB_003b78db;
          }
          uVar17 = (ulong)uVar20;
          if (*p->pCur != '=') {
            pcVar9 = "Expecting \"=\" in assign-statement.";
            goto LAB_003b78db;
          }
          p->pCur = p->pCur + 1;
          iVar6 = Prs_ManUtilSkipSpaces(p);
          if (iVar6 != 0) {
            pcVar9 = "Error number 23.";
            iVar6 = extraout_EDX_03;
            goto LAB_003b78db;
          }
          iVar6 = Prs_ManReadExpression(p,uVar20);
          if (iVar6 == 0) goto LAB_003b743e;
          cVar2 = *p->pCur;
          if (cVar2 == ',') goto code_r0x003b77df;
          if (cVar2 != ';') {
            __assert_fail("Prs_ManIsChar(p, \',\')",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x4f8,"int Prs_ManReadModule(Prs_Man_t *)");
          }
          bVar3 = false;
          break;
        case 8:
          local_44 = Prs_ManReadAlways(p);
          goto LAB_003b780c;
        case 9:
          local_44 = Prs_ManReadFunction(p);
LAB_003b780c:
          bVar3 = true;
          break;
        case 10:
          local_44 = Prs_ManUtilSkipUntil(p,(char)uVar17);
          goto LAB_003b776f;
        }
        if (local_44 == 0) goto LAB_003b7441;
LAB_003b781a:
        if ((local_44 == 0) ||
           (iVar6 = Prs_ManUtilSkipSpaces(p), uVar19 = extraout_RDX_00, iVar6 != 0))
        goto LAB_003b7441;
      } while( true );
    }
    bVar1 = pbVar16[1];
    uVar20 = (uint)bVar1;
    if (bVar1 != 0x2a) {
      if (bVar1 == 0x2f) {
        pbVar16 = pbVar16 + 2;
        p->pCur = (char *)pbVar16;
        if (pbVar16 < pbVar22) {
          while (*pbVar16 != 10) {
            pbVar16 = pbVar16 + 1;
            p->pCur = (char *)pbVar16;
            if (pbVar16 == pbVar22) goto LAB_003b75c6;
          }
          pbVar16 = pbVar16 + 1;
          goto LAB_003b7565;
        }
      }
      goto LAB_003b75c6;
    }
    pbVar16 = pbVar16 + 2;
    p->pCur = (char *)pbVar16;
    if (pbVar22 <= pbVar16) goto LAB_003b75c6;
    while ((*pbVar16 != 0x2a || (pbVar16[1] != 0x2f))) {
      pbVar16 = pbVar16 + 1;
      p->pCur = (char *)pbVar16;
      if (pbVar16 == pbVar22) goto LAB_003b75c6;
    }
    pbVar16 = pbVar16 + 2;
LAB_003b7565:
    p->pCur = (char *)pbVar16;
  } while( true );
code_r0x003b7352:
  pcVar9 = strchr((char *)pbVar16,10);
  if (pcVar9 != (char *)0x0) {
    pbVar16 = (byte *)(pcVar9 + 1);
    p->pCur = (char *)pbVar16;
  }
  while( true ) {
    if (pbVar22 <= pbVar16) goto LAB_003b7412;
    while( true ) {
      uVar17 = (ulong)*pbVar16;
      if (0x2f < uVar17) goto LAB_003b7344;
      if ((0x100002600U >> (uVar17 & 0x3f) & 1) == 0) break;
      pbVar16 = pbVar16 + 1;
      p->pCur = (char *)pbVar16;
    }
    if (uVar17 != 0x2f) break;
    if (pbVar16[1] == 0x2a) {
      pbVar16 = pbVar16 + 2;
      p->pCur = (char *)pbVar16;
      if (pbVar22 <= pbVar16) goto LAB_003b7344;
      while ((*pbVar16 != 0x2a || (pbVar16[1] != 0x2f))) {
        pbVar16 = pbVar16 + 1;
        p->pCur = (char *)pbVar16;
        if (pbVar16 == pbVar22) goto LAB_003b7344;
      }
      pbVar16 = pbVar16 + 2;
    }
    else {
      if (pbVar16[1] != 0x2f) goto LAB_003b7344;
      pbVar16 = pbVar16 + 2;
      p->pCur = (char *)pbVar16;
      if (pbVar22 <= pbVar16) goto LAB_003b7344;
      while (bVar1 = *pbVar16, pbVar16 = pbVar16 + 1, bVar1 != 10) {
        p->pCur = (char *)pbVar16;
        if (pbVar16 == pbVar22) goto LAB_003b7344;
      }
    }
    p->pCur = (char *)pbVar16;
  }
  if (uVar17 == 0) goto LAB_003b7412;
  goto LAB_003b7344;
code_r0x003b77df:
  p->pCur = p->pCur + 1;
  iVar6 = Prs_ManUtilSkipSpaces(p);
  if (iVar6 != 0) {
    pcVar9 = "Error number 23a.";
    iVar6 = extraout_EDX_04;
LAB_003b78db:
    Prs_ManErrorSet(p,pcVar9,iVar6);
    goto LAB_003b743e;
  }
  goto LAB_003b778c;
}

Assistant:

Vec_Ptr_t * Prs_ManReadVerilog( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Prs_Man_t * p = Prs_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Abc_NamStrFindOrAdd( p->pFuns, "1\'b0", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'b1", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'bx", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'bz", NULL );
    Prs_NtkAddVerilogDirectives( p );
    Prs_ManReadDesign( p );   
    Prs_ManPrintModules( p );
    if ( Prs_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Prs_ManFree( p );
    return vPrs;
}